

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.c
# Opt level: O0

void blake2b_write(BinarySink *bs,void *vp,size_t len)

{
  blake2b *local_38;
  size_t chunk;
  uint8_t *p;
  blake2b *s;
  size_t len_local;
  void *vp_local;
  BinarySink *bs_local;
  
  chunk = (size_t)vp;
  s = (blake2b *)len;
  while (s != (blake2b *)0x0) {
    if (bs[-1].write == (_func_void_BinarySink_ptr_void_ptr_size_t *)0x80) {
      f_outer((uint64_t *)&bs[-10].binarysink_,(uint8_t *)((long)&bs[-7].writefmtv + 4),
              (uint64_t)bs[-1].writefmtv,(uint64_t)bs[-1].binarysink_,0);
      bs[-1].write = (_func_void_BinarySink_ptr_void_ptr_size_t *)0x0;
    }
    local_38 = (blake2b *)(0x80 - (long)bs[-1].write);
    if (s < local_38) {
      local_38 = s;
    }
    memcpy(bs[-1].write + -0x9c + (long)&bs->write,(void *)chunk,(size_t)local_38);
    bs[-1].write = (_func_void_BinarySink_ptr_void_ptr_size_t *)
                   ((long)local_38->h + (long)bs[-1].write);
    chunk = (long)local_38->h + chunk;
    s = (blake2b *)((long)s - (long)local_38);
    bs[-1].binarysink_ = (BinarySink *)((long)&(bs[-1].binarysink_)->write + (long)local_38->h);
    bs[-1].writefmtv = bs[-1].writefmtv + (int)(uint)((blake2b *)bs[-1].binarysink_ < local_38);
  }
  return;
}

Assistant:

static void blake2b_write(BinarySink *bs, const void *vp, size_t len)
{
    blake2b *s = BinarySink_DOWNCAST(bs, blake2b);
    const uint8_t *p = vp;

    while (len > 0) {
        if (s->used == sizeof(s->block)) {
            f_outer(s->h, s->block, s->lenhi, s->lenlo, 0);
            s->used = 0;
        }

        size_t chunk = sizeof(s->block) - s->used;
        if (chunk > len)
            chunk = len;

        memcpy(s->block + s->used, p, chunk);
        s->used += chunk;
        p += chunk;
        len -= chunk;

        s->lenlo += chunk;
        s->lenhi += (s->lenlo < chunk);
    }
}